

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_get_dynamic_node_properties
              (SOURCE_HANDLE source,node_properties *dynamic_node_properties_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SOURCE_INSTANCE *source_instance;
  uint32_t item_count;
  int result;
  node_properties *dynamic_node_properties_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._4_4_ = 0x3222;
  }
  else {
    _item_count = dynamic_node_properties_value;
    dynamic_node_properties_value_local = &source->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,(uint32_t *)&source_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)source_instance < 6) {
        source_instance._4_4_ = 0x3230;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(source->composite_value,5);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          source_instance._4_4_ = 0x3238;
        }
        else {
          iVar1 = amqpvalue_get_map(value,_item_count);
          if (iVar1 == 0) {
            source_instance._4_4_ = 0;
          }
          else {
            source_instance._4_4_ = 0x323f;
          }
        }
      }
    }
    else {
      source_instance._4_4_ = 0x322a;
    }
  }
  return source_instance._4_4_;
}

Assistant:

int source_get_dynamic_node_properties(SOURCE_HANDLE source, node_properties* dynamic_node_properties_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_node_properties(item_value, dynamic_node_properties_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}